

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O3

bool __thiscall
libtorrent::aux::tracker_manager::incoming_packet
          (tracker_manager *this,string_view hostname,span<const_char> buf)

{
  udp_tracker_connection *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  session_logger *psVar1;
  bool bVar2;
  uint ret;
  uint uVar3;
  iterator iVar4;
  long lVar5;
  uint ret_1;
  uint uVar6;
  uint32_t transaction;
  uint local_54;
  long *local_50 [2];
  long local_40 [2];
  
  uVar3 = 0;
  uVar6 = 0;
  if (0xf < buf.m_len) {
    lVar5 = 0;
    do {
      uVar3 = uVar3 << 8 | (uint)(byte)buf.m_ptr[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    uVar6 = 0;
    if (uVar3 < 4) {
      lVar5 = 4;
      do {
        uVar6 = uVar6 << 8 | (uint)(byte)buf.m_ptr[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      local_54 = uVar6;
      iVar4 = ::std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this,&local_54);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        psVar1 = this->m_ses;
        local_50[0] = local_40;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,hostname._M_str,hostname._M_str + hostname._M_len);
        (*psVar1->_vptr_session_logger[1])
                  (psVar1,"incoming UDP tracker packet from %s has invalid transaction ID (%x)",
                   local_50[0],(ulong)local_54);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        uVar6 = 0;
      }
      else {
        this_00 = *(udp_tracker_connection **)
                   ((long)iVar4.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
                          ._M_cur + 0x10);
        this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)iVar4.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
                          ._M_cur + 0x18);
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        bVar2 = udp_tracker_connection::on_receive_hostname(this_00,hostname,buf);
        uVar6 = (uint)bVar2;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      }
    }
  }
  return SUB41(uVar6,0);
}

Assistant:

bool tracker_manager::incoming_packet(string_view const hostname
		, span<char const> const buf)
	{
		TORRENT_ASSERT(is_single_thread());
		// ignore packets smaller than 8 bytes
		if (buf.size() < 16) return false;

		// the first word is the action, if it's not [0, 3]
		// it's not a valid udp tracker response
		span<const char> ptr = buf;
		std::uint32_t const action = aux::read_uint32(ptr);
		if (action > 3) return false;

		std::uint32_t const transaction = aux::read_uint32(ptr);
		auto const i = m_udp_conns.find(transaction);

		if (i == m_udp_conns.end())
		{
#ifndef TORRENT_DISABLE_LOGGING
			// now, this may not have been meant to be a tracker response,
			// but chances are pretty good, so it's probably worth logging
			m_ses.session_log("incoming UDP tracker packet from %s has invalid "
				"transaction ID (%x)", std::string(hostname).c_str(), int(transaction));
#endif
			return false;
		}

		auto const p = i->second;
		// on_receive() may remove the tracker connection from the list
		return p->on_receive_hostname(hostname, buf);
	}